

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  uint uVar1;
  VmInstructionType VVar2;
  VmBlock **ppVVar3;
  VmValue **ppVVar4;
  uint uVar5;
  VmBlock *curr;
  VmBlock *pVVar6;
  VmBlock *pVVar7;
  uint uVar8;
  ulong uVar9;
  VmBlock *pVVar10;
  VmInstruction *inst;
  VmValue *pVVar11;
  
  pVVar6 = function->firstBlock;
  if (pVVar6 != (VmBlock *)0x0) {
    do {
      (pVVar6->predecessors).count = 0;
      (pVVar6->successors).count = 0;
      pVVar6 = pVVar6->nextSibling;
    } while (pVVar6 != (VmBlock *)0x0);
    for (pVVar6 = function->firstBlock; pVVar6 != (VmBlock *)0x0; pVVar6 = pVVar6->nextSibling) {
      if ((pVVar6->super_VmValue).users.count != 0) {
        uVar9 = 0;
        do {
          pVVar11 = (pVVar6->super_VmValue).users.data[uVar9];
          if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
            pVVar11 = (VmValue *)0x0;
          }
          if ((pVVar11 != (VmValue *)0x0) && (*(int *)&pVVar11[1]._vptr_VmValue != 0x4d)) {
            uVar1 = (pVVar6->predecessors).count;
            if (uVar1 == (pVVar6->predecessors).max) {
              SmallArray<VmBlock_*,_4U>::grow(&pVVar6->predecessors,uVar1);
            }
            ppVVar3 = (pVVar6->predecessors).data;
            if (ppVVar3 == (VmBlock **)0x0) {
LAB_00289af7:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,
                            "void SmallArray<VmBlock *, 4>::push_back(const T &) [T = VmBlock *, N = 4]"
                           );
            }
            pVVar10 = (VmBlock *)pVVar11[1].users.data;
            uVar1 = (pVVar6->predecessors).count;
            (pVVar6->predecessors).count = uVar1 + 1;
            ppVVar3[uVar1] = pVVar10;
            ppVVar4 = pVVar11[1].users.data;
            if (*(uint *)(ppVVar4 + 0x25) == *(uint *)((long)ppVVar4 + 300)) {
              SmallArray<VmBlock_*,_4U>::grow
                        ((SmallArray<VmBlock_*,_4U> *)(ppVVar4 + 0x24),*(uint *)(ppVVar4 + 0x25));
            }
            ppVVar3 = ((SmallArray<VmBlock_*,_4U> *)(ppVVar4 + 0x24))->data;
            if (ppVVar3 == (VmBlock **)0x0) goto LAB_00289af7;
            uVar1 = *(uint *)(ppVVar4 + 0x25);
            *(uint *)(ppVVar4 + 0x25) = uVar1 + 1;
            ppVVar3[uVar1] = pVVar6;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (pVVar6->super_VmValue).users.count);
      }
    }
    for (pVVar6 = function->firstBlock; pVVar6 != (VmBlock *)0x0; pVVar6 = pVVar6->nextSibling) {
      pVVar6->visited = false;
    }
    MarkReachableBlocks(function->firstBlock);
    pVVar6 = function->firstBlock->nextSibling;
    while (pVVar10 = pVVar6, pVVar10 != (VmBlock *)0x0) {
      pVVar6 = pVVar10->nextSibling;
      if (pVVar10->visited == false) {
LAB_002898ff:
        uVar1 = (pVVar10->super_VmValue).users.count;
        if (uVar1 != 0) {
          inst = (VmInstruction *)(pVVar10->super_VmValue).users.data[uVar1 - 1];
          if ((inst == (VmInstruction *)0x0) || ((inst->super_VmValue).typeID != 2)) {
            inst = (VmInstruction *)0x0;
          }
          VVar2 = inst->cmd;
          if (VVar2 - VM_INST_JUMP_Z < 2) {
            uVar1 = (inst->arguments).count;
            if (uVar1 < 2) {
LAB_00289ad8:
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                           );
            }
            ppVVar4 = (inst->arguments).data;
            pVVar7 = (VmBlock *)ppVVar4[1];
            if (pVVar7 == pVVar10) {
              if (uVar1 == 2) goto LAB_00289ad8;
              pVVar7 = (VmBlock *)ppVVar4[2];
            }
            anon_unknown.dwarf_233176::ChangeInstructionTo
                      (module,inst,VM_INST_JUMP,&pVVar7->super_VmValue,(VmValue *)0x0,(VmValue *)0x0
                       ,(VmValue *)0x0,(VmValue *)0x0,(uint *)0x0);
          }
          else if (VVar2 == VM_INST_JUMP) {
            VmBlock::RemoveInstruction(inst->parent,inst);
          }
          else if ((VVar2 == VM_INST_PHI) && (uVar1 = (inst->arguments).count, uVar1 != 0)) {
            ppVVar4 = (inst->arguments).data;
            uVar9 = 0;
            do {
              uVar5 = (uint)uVar9;
              uVar8 = uVar5 + 1;
              if (uVar1 <= uVar8) goto LAB_00289ad8;
              pVVar7 = (VmBlock *)ppVVar4[uVar8];
              if (pVVar7 == pVVar10) {
                VmValue::RemoveUse(ppVVar4[uVar9],&inst->super_VmValue);
                VmValue::RemoveUse((VmValue *)pVVar7,&inst->super_VmValue);
                uVar1 = (inst->arguments).count;
                if ((uVar1 < 2) || (uVar1 <= uVar5)) goto LAB_00289ad8;
                ppVVar4 = (inst->arguments).data;
                ppVVar4[uVar9] = ppVVar4[uVar1 - 2];
                if (uVar1 <= uVar8) goto LAB_00289ad8;
                ppVVar4 = (inst->arguments).data;
                uVar5 = uVar1 - 1;
                ppVVar4[uVar8] = ppVVar4[uVar5];
                (inst->arguments).count = uVar5;
                if (uVar5 == 0) {
                  __assert_fail("count > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                ,0x183,
                                "void SmallArray<VmValue *, 4>::pop_back() [T = VmValue *, N = 4]");
                }
                (inst->arguments).count = uVar1 - 2;
                break;
              }
              uVar9 = (ulong)(uVar5 + 2);
            } while (uVar5 + 2 < uVar1);
          }
          goto LAB_002898ff;
        }
      }
    }
    pVVar6 = function->firstBlock;
    while (pVVar6 != (VmBlock *)0x0) {
      pVVar10 = pVVar6->nextSibling;
      RunDeadCodeElimiation(ctx,module,pVVar6);
      pVVar6 = pVVar10;
    }
    for (pVVar6 = function->firstBlock; pVVar6 != (VmBlock *)0x0; pVVar6 = pVVar6->nextSibling) {
      if (pVVar6->visited == false) {
        __assert_fail("curr->visited",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1352,
                      "void RunDeadCodeElimiation(ExpressionContext &, VmModule *, VmFunction *)");
      }
      pVVar6->visited = false;
    }
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	if(!function->firstBlock)
		return;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		curr->predecessors.clear();
		curr->successors.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	MarkReachableBlocks(function->firstBlock);

	// Remove blocks that are unreachable from entry
	for(VmBlock *curr = function->firstBlock->nextSibling; curr;)
	{
		VmBlock *next = curr->nextSibling;

		if(!curr->visited)
		{
			while(!curr->users.empty())
			{
				VmInstruction *inst = getType<VmInstruction>(curr->users.back());

				if(inst->cmd == VM_INST_JUMP)
				{
					inst->parent->RemoveInstruction(inst);
				}
				else if(inst->cmd == VM_INST_JUMP_NZ || inst->cmd == VM_INST_JUMP_Z)
				{
					if(inst->arguments[1] == curr)
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[2], NULL, NULL, NULL, NULL, NULL);
					else
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[1], NULL, NULL, NULL, NULL, NULL);
				}
				else if(inst->cmd == VM_INST_PHI)
				{
					for(unsigned i = 0; i < inst->arguments.size(); i += 2)
					{
						VmValue *option = inst->arguments[i];
						VmValue *edge = inst->arguments[i + 1];

						if(edge == curr)
						{
							option->RemoveUse(inst);
							edge->RemoveUse(inst);

							inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
							inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

							inst->arguments.pop_back();
							inst->arguments.pop_back();

							break;
						}
					}
				}
			}
		}

		curr = next;
	}

	VmBlock *curr = function->firstBlock;

	while(curr)
	{
		VmBlock *next = curr->nextSibling;
		RunDeadCodeElimiation(ctx, module, curr);
		curr = next;
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// Check that only reachable blocks remain
		assert(curr->visited);

		curr->visited = false;
	}
}